

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,int *value)

{
  allocator<unsigned_long> *paVar1;
  undefined1 *this_00;
  unsigned_long uVar2;
  value_type vVar3;
  int *__p;
  ulong uVar4;
  bool bVar5;
  reference puVar6;
  int *data;
  size_t sVar7;
  size_type sVar8;
  unsigned_long *puVar9;
  reference pvVar10;
  iterator iVar11;
  iterator end_00;
  CoordinateOrder *pCVar12;
  CoordinateOrder *pCVar13;
  allocator<int> local_241;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_240;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_238;
  unsigned_long *local_230;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_228;
  allocator<int> local_219;
  undefined1 local_218 [8];
  View<int,_false,_std::allocator<unsigned_long>_> view2;
  undefined1 local_1c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> viewT;
  allocator<int> local_169;
  undefined1 local_168 [8];
  View<int,_true,_std::allocator<unsigned_long>_> view1;
  size_type local_120;
  size_t local_118;
  ulong local_110;
  size_t j_1;
  value_type local_100;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  value_type local_d8;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  undefined1 local_b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  undefined1 local_90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  size_t j;
  value_type *newData;
  unsigned_long local_58;
  size_t x;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  size_t newSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  int *value_local;
  Marray<int,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  end_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_local;
  
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  this_local = (Marray<int,_std::allocator<unsigned_long>_> *)end._M_current;
  end_local = begin;
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
  it._M_current = (unsigned_long *)0x1;
  x = (size_t)end_local._M_current;
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&x,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&this_local);
    if (!bVar5) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&x);
    local_58 = *puVar6;
    marray_detail::Assert<bool>(local_58 != 0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize,&local_58);
    it._M_current = local_58 * it._M_current;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&x);
  }
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),(size_type)it._M_current,(void *)0x0);
  for (base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < it._M_current;
      base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    data[(long)base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage] =
         (int)*newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
  if (*(long *)this == 0) goto LAB_002bea8d;
  if (it._M_current == (unsigned_long *)0x1) {
LAB_002be40a:
    *data = **(int **)this;
  }
  else {
    sVar7 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar7 == 0) goto LAB_002be40a;
    sVar7 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    paVar1 = (allocator<unsigned_long> *)
             ((long)&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,sVar7,paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    paVar1 = (allocator<unsigned_long> *)
             ((long)&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,sVar8,paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar7 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    local_d8 = 1;
    paVar1 = (allocator<unsigned_long> *)
             ((long)&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,sVar7,&local_d8,
               paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    local_100 = 1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,sVar8,&local_100,
               (allocator<unsigned_long> *)((long)&j_1 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
    local_110 = 0;
    while( true ) {
      uVar4 = local_110;
      local_118 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      local_120 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
      puVar9 = std::min<unsigned_long>(&local_118,&local_120);
      if (*puVar9 <= uVar4) break;
      view1.geometry_._48_8_ =
           View<int,_false,_std::allocator<unsigned_long>_>::shape
                     ((View<int,_false,_std::allocator<unsigned_long>_> *)this,local_110);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize,
                           local_110);
      puVar9 = std::min<unsigned_long>((unsigned_long *)&view1.geometry_.coordinateOrder_,pvVar10);
      uVar2 = *puVar9;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                           local_110);
      *pvVar10 = uVar2;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                           local_110);
      vVar3 = *pvVar10;
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,
                           local_110);
      *pvVar10 = vVar3;
      local_110 = local_110 + 1;
    }
    std::allocator<int>::allocator(&local_169);
    View<int,_true,_std::allocator<unsigned_long>_>::View
              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_168,&local_169);
    std::allocator<int>::~allocator(&local_169);
    iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    viewT.geometry_._48_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    View<int,false,std::allocator<unsigned_long>>::
    constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)this,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar11._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )viewT.geometry_._48_8_,(View<int,_true,_std::allocator<unsigned_long>_> *)local_168
              );
    iVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    end_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    pCVar12 = View<int,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    pCVar13 = View<int,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    this_00 = &view2.geometry_.field_0x37;
    std::allocator<int>::allocator((allocator<int> *)this_00);
    View<int,false,std::allocator<unsigned_long>>::
    View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)local_1c0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar11._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )end_00._M_current,data,pCVar12,pCVar13,(allocator_type *)this_00);
    std::allocator<int>::~allocator((allocator<int> *)&view2.geometry_.field_0x37);
    std::allocator<int>::allocator(&local_219);
    View<int,_false,_std::allocator<unsigned_long>_>::View
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_218,&local_219);
    std::allocator<int>::~allocator(&local_219);
    local_228._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    local_230 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
    View<int,false,std::allocator<unsigned_long>>::
    view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<int,false,std::allocator<unsigned_long>> *)local_1c0,local_228,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_230,(View<int,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<int,_true,_std::allocator<unsigned_long>_>::squeeze
              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_168);
    View<int,_false,_std::allocator<unsigned_long>_>::squeeze
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<int,_false,_std::allocator<unsigned_long>_>::operator=
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_218,
               (View<int,_true,_std::allocator<unsigned_long>_> *)local_168);
    View<int,_false,_std::allocator<unsigned_long>_>::~View
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<int,_false,_std::allocator<unsigned_long>_>::~View
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c0);
    View<int,_true,_std::allocator<unsigned_long>_>::~View
              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  }
  __p = *(int **)this;
  sVar7 = View<int,_false,_std::allocator<unsigned_long>_>::size
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  __gnu_cxx::new_allocator<int>::deallocate((new_allocator<int> *)(this + 0x40),__p,sVar7);
  *(undefined8 *)this = 0;
LAB_002bea8d:
  local_238._M_current = end_local._M_current;
  local_240._M_current = (unsigned_long *)this_local;
  pCVar12 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  pCVar13 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  std::allocator<int>::allocator(&local_241);
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,local_238,local_240,data,pCVar12,
             pCVar13,&local_241);
  std::allocator<int>::~allocator(&local_241);
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
  return;
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}